

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_pool_impl.cpp
# Opt level: O2

FileHandle __thiscall
libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::open_file
          (file_pool_impl<libtorrent::aux::file_view_entry> *this,storage_index_t st,string *p,
          file_index_t file_index,file_storage *fs,open_mode_t m)

{
  type *this_00;
  header_holder_type *phVar1;
  pointer psVar2;
  file_id file_key_00;
  iterator iVar3;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>
  *poVar4;
  undefined4 in_register_0000000c;
  iterator iVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  file_pool_impl<libtorrent::aux::file_view_entry> *this_01;
  undefined4 in_register_0000008c;
  __shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  pair<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_*,_bool>
  pVar7;
  FileHandle FVar8;
  anon_class_16_2_6e076f23 mod;
  anon_class_16_2_1bc33e9c_for__M_pred __pred;
  open_mode_t in_stack_00000008;
  unique_lock<std::mutex> l;
  file_id file_key;
  list_iterator<boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry::list_hook>,_false>
  opening;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_180 [3];
  FileHandle defer_destruction2;
  FileHandle defer_destruction1;
  wait_open_entry woe;
  __shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2> local_88;
  file_id local_78;
  list_iterator<boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry::list_hook>,_false>
  local_70 [5];
  storage_error local_48;
  
  this_01 = (file_pool_impl<libtorrent::aux::file_view_entry> *)
            CONCAT44(in_register_00000034,st.m_val);
  defer_destruction1.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  defer_destruction1.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  defer_destruction2.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  defer_destruction2.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::unique_lock<std::mutex>::unique_lock(&l,&this_01->m_mutex);
  this_00 = &(this_01->m_files).super_type;
  file_key.first.m_val = (uint)p;
  file_key.second.m_val = (int)fs;
  iVar3 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,std::less<std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>>,boost::multi_index::detail::nth_layer<1,libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
          ::
          find<std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>>
                    ((ordered_index_impl<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,std::less<std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>>,boost::multi_index::detail::nth_layer<1,libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                      *)this_00,&file_key);
  poVar4 = (this_01->m_files).
           super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_*,_boost::multi_index::multi_index_container<libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>_>
           .member;
  if (iVar3.node == poVar4) {
    phVar1 = &(this_01->m_opening_files).super_type.data_.root_plus_size_.m_header;
    local_70[0].members_.nodeptr_ =
         (iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry::list_hook>_*,_false>
          )(this_01->m_opening_files).super_type.data_.root_plus_size_.m_header.super_node.next_;
    __pred._8_8_ = &file_key;
    __pred.file_key = &local_78;
    local_78 = (file_id)phVar1;
    ::std::
    find_if<boost::intrusive::list_iterator<boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry,boost::intrusive::list_member_hook<>,&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry::list_hook>,false>,libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::open_file(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,std::__cxx11::string_const&,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,libtorrent::file_storage_const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::aux::open_mode_tag,void>)::_lambda(libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry_const&)_1_>
              (&opening,local_70,__pred);
    if (opening.members_.nodeptr_ !=
        (iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry::list_hook>_*,_false>
         )phVar1) {
      wait_open_entry::wait_open_entry(&woe);
      boost::intrusive::
      list_impl<boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::wait_open_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::wait_open_entry::list_hook>,_unsigned_long,_true,_void>
      ::push_back((list_impl<boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::wait_open_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::wait_open_entry::list_hook>,_unsigned_long,_true,_void>
                   *)((long)opening.members_.nodeptr_ + 0x20),&woe);
      do {
        ::std::condition_variable::wait((unique_lock *)&woe.cond);
        if (woe.mapping.
            super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) break;
      } while (woe.error.ec.val_ == 0);
      if (woe.error.ec.val_ != 0) {
        throw_ex<libtorrent::storage_error,libtorrent::storage_error&>(&woe.error);
      }
      ::std::__shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2> *)this,
                 &woe.mapping.
                  super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>);
      wait_open_entry::~wait_open_entry(&woe);
      goto LAB_001b393e;
    }
    poVar4 = (this_01->m_files).
             super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_*,_boost::multi_index::multi_index_container<libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>_>
             .member;
  }
  if ((iVar3.node == poVar4) ||
     (((in_stack_00000008.m_val & 1) != 0 &&
      ((((iVar3.node)->
        super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
        ).
        super_index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>
        .super_pod_value_holder<libtorrent::aux::file_view_entry>.space.data_.buf[0x20] & 1U) == 0))
     )) {
    if (this_01->m_size + -1 <= (int)(this_01->m_files).node_count) {
      remove_oldest((file_pool_impl<libtorrent::aux::file_view_entry> *)&woe,
                    (unique_lock<std::mutex> *)this_01);
      ::std::__shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&defer_destruction1.
                  super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2> *)&woe);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &woe.list_hook.super_type.super_type.prev_);
    }
    woe._40_8_ = &woe.field_0x28;
    woe._32_8_ = 0;
    woe.list_hook.super_type.super_type.next_ = (node_ptr)0x0;
    woe.list_hook.super_type.super_type.prev_ = (node_ptr)0x0;
    woe._20_4_ = file_key.second.m_val;
    woe._16_4_ = file_key.first.m_val;
    woe._48_8_ = woe._40_8_;
    boost::intrusive::
    list_impl<boost::intrusive::mhtraits<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry,_boost::intrusive::list_member_hook<>,_&libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::opening_file_entry::list_hook>,_unsigned_long,_true,_void>
    ::push_back(&(this_01->m_opening_files).super_type,(reference)&woe);
    ::std::unique_lock<std::mutex>::unlock(&l);
    file_key_00.second.m_val = file_key.second.m_val;
    file_key_00.first.m_val = file_key.first.m_val;
    open_file_impl((file_view_entry *)&opening,this_01,
                   (string *)CONCAT44(in_register_0000000c,file_index.m_val),(file_index_t)(int)fs,
                   (file_storage *)CONCAT44(in_register_0000008c,m.m_val),in_stack_00000008,
                   file_key_00);
    ::std::unique_lock<std::mutex>::lock(&l);
    pVar7 = boost::multi_index::
            multi_index_container<libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>
            ::insert_<boost::multi_index::detail::lvalue_tag>(&this_01->m_files,&opening);
    iVar3.node = pVar7.first;
    if (pVar7.second == false) {
      if (((in_stack_00000008.m_val & 1) != 0) &&
         ((((iVar3.node)->
           super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
           ).
           super_index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>
           .super_pod_value_holder<libtorrent::aux::file_view_entry>.space.data_.buf[0x20] & 1U) ==
          0)) {
        mod.e = (file_view_entry *)&opening;
        mod.defer_destruction2 = &defer_destruction2;
        boost::multi_index::detail::
        ordered_index_impl<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,std::less<std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>>,boost::multi_index::detail::nth_layer<1,libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
        ::
        modify<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::open_file(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,std::__cxx11::string_const&,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,libtorrent::file_storage_const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::aux::open_mode_tag,void>)::_lambda(libtorrent::aux::file_view_entry&)_2_>
                  ((ordered_index_impl<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,std::less<std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>>,boost::multi_index::detail::nth_layer<1,libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                    *)this_00,iVar3,mod);
      }
      psVar2 = (((this_01->m_files).
                 super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_*,_boost::multi_index::multi_index_container<libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                .member)->
               super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
               ).
               super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
               .super_sequenced_index_node_impl<std::allocator<char>_>.next_;
      iVar5.node = (sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                    *)&psVar2[-3].next_;
      if (psVar2 == (pointer)0x0) {
        iVar5.node = (sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                      *)0x0;
      }
      boost::multi_index::detail::
      sequenced_index<boost::multi_index::detail::nth_layer<2,_libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>,_boost::mpl::vector0<mpl_::na>_>
      ::relocate((sequenced_index<boost::multi_index::detail::nth_layer<2,_libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>,_boost::mpl::vector0<mpl_::na>_>
                  *)this_00,(iterator)iVar3.node,iVar5);
    }
    p_Var6 = (__shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)&((iVar3.node)->
                     super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                     ).
                     super_index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>
                     .super_pod_value_holder<libtorrent::aux::file_view_entry>.space.data_ + 8);
    ::std::__shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_88,p_Var6);
    local_48.ec.val_ = 0;
    local_48.ec.failed_ = false;
    local_48.ec.cat_ =
         &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
    local_48._16_3_ = 0xffffff;
    local_48.operation = unknown;
    notify_file_open(this_01,(opening_file_entry *)&woe,(FileHandle *)&local_88,&local_48);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
    ::std::__shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2> *)this,
               p_Var6);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_180);
    opening_file_entry::~opening_file_entry((opening_file_entry *)&woe);
  }
  else {
    boost::multi_index::detail::
    ordered_index_impl<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,std::less<std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>>,boost::multi_index::detail::nth_layer<1,libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
    ::
    modify<libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>::open_file(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,std::__cxx11::string_const&,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,libtorrent::file_storage_const&,libtorrent::flags::bitfield_flag<unsigned_int,libtorrent::aux::open_mode_tag,void>)::_lambda(libtorrent::aux::file_view_entry&)_1_>
              ((ordered_index_impl<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,std::less<std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>>,boost::multi_index::detail::nth_layer<1,libtorrent::aux::file_view_entry,boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,std::pair<libtorrent::aux::strong_typedef<unsigned_int,libtorrent::storage_index_tag_t,void>,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>>,&libtorrent::aux::file_view_entry::key>,mpl_::na,mpl_::na>,boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>>,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na,mpl_::na>,std::allocator<libtorrent::aux::file_view_entry>>,boost::mpl::vector0<mpl_::na>,boost::multi_index::detail::ordered_unique_tag,boost::multi_index::detail::null_augment_policy>
                *)this_00,iVar3.node);
    psVar2 = (((this_01->m_files).
               super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>_>_*,_boost::multi_index::multi_index_container<libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>_>
              .member)->
             super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
             ).
             super_sequenced_index_node_trampoline<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
             .super_sequenced_index_node_impl<std::allocator<char>_>.next_;
    iVar5.node = (sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                  *)&psVar2[-3].next_;
    if (psVar2 == (pointer)0x0) {
      iVar5.node = (sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                    *)0x0;
    }
    boost::multi_index::detail::
    sequenced_index<boost::multi_index::detail::nth_layer<2,_libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>,_boost::mpl::vector0<mpl_::na>_>
    ::relocate((sequenced_index<boost::multi_index::detail::nth_layer<2,_libtorrent::aux::file_view_entry,_boost::multi_index::indexed_by<boost::multi_index::ordered_unique<boost::multi_index::member<libtorrent::aux::file_view_entry,_std::pair<libtorrent::aux::strong_typedef<unsigned_int,_libtorrent::storage_index_tag_t,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_&libtorrent::aux::file_view_entry::key>,_mpl_::na,_mpl_::na>,_boost::multi_index::sequenced<boost::multi_index::tag<mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<libtorrent::aux::file_view_entry>_>,_boost::mpl::vector0<mpl_::na>_>
                *)this_00,(iterator)iVar3.node,iVar5);
    ::std::__shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&((iVar3.node)->
                       super_sequenced_index_node<boost::multi_index::detail::index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>_>
                       ).
                       super_index_node_base<libtorrent::aux::file_view_entry,_std::allocator<libtorrent::aux::file_view_entry>_>
                       .super_pod_value_holder<libtorrent::aux::file_view_entry>.space.data_ + 8));
  }
LAB_001b393e:
  ::std::unique_lock<std::mutex>::~unique_lock(&l);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&defer_destruction2.
              super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&defer_destruction1.
              super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  FVar8.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  FVar8.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (FileHandle)
         FVar8.super___shared_ptr<libtorrent::aux::file_mapping,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

typename file_pool_impl<FileEntry>::FileHandle
	file_pool_impl<FileEntry>::open_file(storage_index_t st, std::string const& p
		, file_index_t const file_index, file_storage const& fs
		, open_mode_t const m
#if TORRENT_HAVE_MAP_VIEW_OF_FILE
		, std::shared_ptr<std::mutex> open_unmap_lock
#endif
		)
	{
		// potentially used to hold a reference to a file object that's
		// about to be destructed. If we have such object we assign it to
		// this member to be destructed after we release the std::mutex. On some
		// operating systems (such as OSX) closing a file may take a long
		// time. We don't want to hold the std::mutex for that.
		FileHandle defer_destruction1;
		FileHandle defer_destruction2;

		std::unique_lock<std::mutex> l(m_mutex);

		TORRENT_ASSERT(is_complete(p));
		auto& key_view = m_files.template get<0>();
		file_id const file_key{st, file_index};
		auto i = key_view.find(file_key);

		if (i == key_view.end())
		{
			auto opening = std::find_if(m_opening_files.begin(), m_opening_files.end()
				, [&file_key, m](opening_file_entry const& oe) {
					return oe.file_key == file_key
						&& (!(m & open_mode::write) || (oe.mode & open_mode::write));
				});
			if (opening != m_opening_files.end())
			{
				wait_open_entry woe;
				opening->waiters.push_back(woe);

#if TRACE_FILE_POOL
				std::cout << std::this_thread::get_id() << " waiting for: ("
					<< file_key.first << ", " << file_key.second << ")\n";
#endif
				do {
					woe.cond.wait(l);
				} while (!woe.mapping && !woe.error);
				if (woe.error)
				{
#if TRACE_FILE_POOL
					std::cout << std::this_thread::get_id() << " open failed: ("
						<< file_key.first << ", " << file_key.second
						<< "): " << woe.error.ec << std::endl;
#endif
					throw_ex<storage_error>(woe.error);
				}

#if TRACE_FILE_POOL
				std::cout << std::this_thread::get_id() << " file opened: ("
					<< file_key.first << ", " << file_key.second << ")\n";
#endif
				return woe.mapping;
			}
		}

		// make sure the write bit is set if we asked for it
		// it's OK to use a read-write file if we just asked for read. But if
		// we asked for write, the file we serve back must be opened in write
		// mode
		if (i != key_view.end()
			&& (!(m & open_mode::write) || (i->mode & open_mode::write)))
		{
			key_view.modify(i, [&](FileEntry& e)
			{
				e.last_use = aux::time_now();
			});

			auto& lru_view = m_files. template get<1>();
			lru_view.relocate(m_files. template project<1>(i), lru_view.begin());

			return i->mapping;
		}

		if (int(m_files.size()) >= m_size - 1)
		{
			// the file cache is at its maximum size, close
			// the least recently used file
			defer_destruction1 = remove_oldest(l);
		}

		opening_file_entry ofe;
		ofe.file_key = file_key;
		ofe.mode = m;
		m_opening_files.push_back(ofe);

#if TRACE_FILE_POOL
		std::cout << std::this_thread::get_id() << " opening file: ("
			<< file_key.first << ", " << file_key.second << ")\n";
#endif

		l.unlock();

		try
		{
			FileEntry e = open_file_impl(p, file_index, fs, m, file_key
#if TORRENT_HAVE_MAP_VIEW_OF_FILE
				, open_unmap_lock
#endif
				);

			l.lock();

			// there's an edge case where two threads are racing to insert a newly
			// opened file, one thread is opening a file for writing and the other
			// fore reading. If the reading thread wins, it's important that the
			// thread opening for writing still overwrites the file in the pool,
			// since a file opened for reading and writing can be used for both.
			// So, we can't move e in here, because we may need it again of the
			// insertion failed.
			// if the insertion failed, check to see if we can use the existing
			// entry. If not, overwrite it with the newly opened file ``e``.
			bool added;
			std::tie(i, added) = key_view.insert(e);
			if (added == false)
			{
				// this is the case where this file was already in the pool. Make
				// sure we can use it. If we asked for write mode, it must have been
				// opened in write mode too.
				TORRENT_ASSERT(i != key_view.end());

				if ((m & open_mode::write) && !(i->mode & open_mode::write))
				{
					key_view.modify(i, [&](FileEntry& fe)
					{
						defer_destruction2 = std::move(fe.mapping);
						fe = std::move(e);
					});
				}

				auto& lru_view = m_files.template get<1>();
				lru_view.relocate(m_files. template project<1>(i), lru_view.begin());
			}
			notify_file_open(ofe, i->mapping, storage_error());
			return i->mapping;
		}
		catch (storage_error const& se)
		{
			if (!l.owns_lock()) l.lock();
			notify_file_open(ofe, {}, se);
			throw;
		}
		catch (std::bad_alloc const&)
		{
			if (!l.owns_lock()) l.lock();
			notify_file_open(ofe, {}, storage_error(
				errors::no_memory, file_index, operation_t::file_open));
			throw;
		}
		catch (boost::system::system_error const& se)
		{
			if (!l.owns_lock()) l.lock();
			notify_file_open(ofe, {}, storage_error(
				se.code(), file_index, operation_t::file_open));
			throw;
		}
		catch (...)
		{
			if (!l.owns_lock()) l.lock();
			notify_file_open(ofe, {}, storage_error(
				errors::no_memory, file_index, operation_t::file_open));
			throw;
		}
	}